

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O1

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::LinTerms,mp::AlgConRange>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *con,int param_2)

{
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  double dVar5;
  double dVar6;
  AlgConRange rng;
  type tVar7;
  bool bVar8;
  CtxVal CVar9;
  ConstraintAcceptanceLevel CVar10;
  byte bVar11;
  int v;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  VarOrConst VVar12;
  NodeRange NVar13;
  NLConstraint nlc;
  LinTerms lt;
  LinearFunctionalConstraint exprTerm;
  int local_414;
  undefined1 local_410 [160];
  inline_storage<int,_6U> iStack_370;
  double local_358;
  double dStack_350;
  int local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  ulong local_338;
  ulong local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [3];
  type local_2f8;
  type local_2f0;
  type local_2e8;
  undefined1 local_2e0 [24];
  undefined1 local_2c8 [104];
  type local_260;
  type local_258;
  undefined1 local_248 [24];
  double local_230;
  double dStack_228;
  NLConstraint local_220;
  undefined1 local_150 [72];
  int *local_108;
  ulong local_100;
  size_ty local_f8;
  int local_f0 [6];
  LinearFunctionalConstraint local_d8;
  
  local_150._0_8_ = local_150 + 0x18;
  local_150._8_8_ = 6;
  local_150._16_8_ = 0;
  local_100 = 6;
  local_108 = local_f0;
  local_f8 = 0;
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (&local_d8,
             (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_LinTerms,(LinTerms *)local_150);
  dVar5 = (con->super_AlgConRange).lb_;
  dVar6 = (con->super_AlgConRange).ub_;
  rng = con->super_AlgConRange;
  if ((((local_d8.affine_expr_.constant_term_ != 0.0) || (NAN(local_d8.affine_expr_.constant_term_))
       ) || (local_d8.affine_expr_.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size != 1)) ||
     ((*local_d8.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr != 1.0 ||
      (NAN(*local_d8.affine_expr_.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr))))) {
    if (local_d8.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size == 0) {
      value.c_ = 2.12199579047121e-314;
    }
    else {
      CVar9 = CTX_NEG;
      if (-1e+20 < dVar5) {
        CVar9 = (dVar6 < 1e+20) + 2 + (uint)(dVar6 < 1e+20);
      }
      if (local_d8.super_FunctionalConstraint.ctx.value_ - CTX_ROOT < 2) {
        bVar8 = CVar9 - CTX_NEG < 2;
LAB_00168073:
        CVar9 = CTX_MIX;
        if (bVar8) {
LAB_0016807a:
          local_d8.super_FunctionalConstraint.ctx.value_ = CVar9;
        }
      }
      else {
        if (local_d8.super_FunctionalConstraint.ctx.value_ == CTX_NONE) goto LAB_0016807a;
        if ((local_d8.super_FunctionalConstraint.ctx.value_ == CTX_NEG) &&
           (CVar9 < (CTX_MIX|CTX_ROOT))) {
          bVar8 = (0x16U >> CVar9 & 1) != 0;
          goto LAB_00168073;
        }
      }
      VVar12 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::AssignResult2Args<mp::LinearFunctionalConstraint>
                         ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)(this + -0x208),&local_d8);
      value = VVar12.field_1;
      if (((undefined1  [16])VVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        NVar13 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)(this + -0x208),value.c_);
        value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar13.ir_;
      }
    }
  }
  else {
    value._4_4_ = 0;
    value.var_ = *local_d8.affine_expr_.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  }
  v = value.var_;
  if (v < 0) {
LAB_0016821b:
    bVar11 = 0;
LAB_0016821d:
    if ((v < 0) &&
       (CVar10 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                           ((BasicConstraintKeeper *)(this + 0x9d8)),
       (bool)(~bVar11 & CVar10 == Recommended))) {
      bVar8 = false;
      goto LAB_0016853f;
    }
    NLConstraint::NLConstraint((NLConstraint *)local_410,(LinTerms *)local_150,v,rng,false);
    paVar3 = &local_220.super_BasicConstraint.name_.field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_410 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ == paVar1) {
      local_220.super_BasicConstraint.name_.field_2._8_8_ = local_410._24_8_;
      local_220.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_220.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_410._0_8_;
    }
    local_220.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_ = local_410._17_7_;
    local_220.super_BasicConstraint.name_.field_2._M_local_buf[0] = local_410[0x10];
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_410 + 0x30);
    paVar4 = &local_220.lcr_.super_BasicConstraint.name_.field_2;
    local_220.super_BasicConstraint.name_._M_string_length = local_410._8_8_;
    local_410._8_8_ = 0;
    local_410[0x10] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._32_8_ == paVar2) {
      local_220.lcr_.super_BasicConstraint.name_.field_2._8_8_ = local_410._56_8_;
      local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_410._32_8_;
    }
    local_220.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity = local_410._48_8_;
    local_220.lcr_.super_BasicConstraint.name_._M_string_length = local_410._40_8_;
    local_410._40_8_ = 0;
    local_410._48_8_ = local_410._48_8_ & 0xffffffffffffff00;
    local_410._0_8_ = paVar1;
    local_410._32_8_ = paVar2;
    if ((ulong)local_410._72_8_ < 7) {
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_220.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_410._80_8_ != 0) {
        memcpy(local_220.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               (void *)local_410._64_8_,local_410._80_8_ * 8);
      }
    }
    else {
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)local_410._64_8_;
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = local_410._72_8_;
      local_410._72_8_ = 6;
      local_410._80_8_ = 0;
      local_410._64_8_ = (inline_storage<double,_6U> *)(local_410 + 0x58);
    }
    if ((ulong)local_410._144_8_ < 7) {
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_220.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if ((double)local_410._152_8_ != 0.0) {
        memcpy(local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (void *)local_410._136_8_,local_410._152_8_ * 4);
      }
    }
    else {
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)local_410._136_8_;
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = local_410._144_8_;
      local_410._144_8_ = 6;
      local_410._152_8_ = 0.0;
      local_410._136_8_ = &iStack_370;
    }
    local_220.lcr_.super_AlgConRange.lb_ = local_358;
    local_220.lcr_.super_AlgConRange.ub_ = dStack_350;
    local_220.expr_ = local_348;
    NVar13 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddConstraintAndTryNoteResultVariable<mp::NLConstraint>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)(this + -0x208),&local_220);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)(this + -0x208),NVar13);
    if (6 < local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_220.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_220.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_220.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_220.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p != paVar4) {
      operator_delete(local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_220.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.super_BasicConstraint.name_._M_dataplus._M_p != paVar3) {
      operator_delete(local_220.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_220.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < (ulong)local_410._144_8_) {
      operator_delete((void *)local_410._136_8_,local_410._144_8_ << 2);
    }
    if (6 < (ulong)local_410._72_8_) {
      operator_delete((void *)local_410._64_8_,local_410._72_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._32_8_ != paVar2) {
      operator_delete((void *)local_410._32_8_,local_410._48_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != paVar1) {
LAB_00168530:
      operator_delete((void *)local_410._0_8_,CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
    }
  }
  else {
    if ((*(int *)(this + -0x140) - *(int *)(this + -0x150)) * 8 + *(int *)(this + -0x138) <= v) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 false);
    }
    CVar10 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                       ((BasicConstraintKeeper *)(this + 0x6e40));
    if (CVar10 != Recommended) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 true);
    }
    this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this + -0x208);
    bVar8 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    if (!bVar8) goto LAB_0016821b;
    local_410._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3ff0000000000000;
    local_414 = v;
    gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
              ((small_vector_base<std::allocator<double>,6u> *)local_150,(double *)local_410);
    gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
              ((small_vector_base<std::allocator<int>,6u> *)&local_108,&local_414);
    LinTerms::sort_terms((LinTerms *)local_150,true);
    if ((ulong)local_150._16_8_ < 2) {
      bVar8 = true;
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds(this_00,v,dVar5,dVar6);
      goto LAB_0016853f;
    }
    CVar10 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                       ((BasicConstraintKeeper *)(this + 0x9d8));
    if (CVar10 != Recommended) {
      v = -1;
      bVar11 = 1;
      goto LAB_0016821d;
    }
    gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<double>,6u> *)&local_340,local_150);
    gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<int>,6u> *)&local_2f8,
               (small_vector_base<std::allocator<int>,6u> *)&local_108);
    local_410._48_8_ = local_330;
    dVar5 = (con->super_AlgConRange).lb_;
    dVar6 = (con->super_AlgConRange).ub_;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_410 + 0x10);
    local_410._8_8_ = 0;
    local_410[0x10] = '\0';
    local_410._0_8_ = paVar1;
    if (local_338 < 7) {
      local_410._32_8_ = local_410 + 0x38;
      local_410._40_8_ = 6;
      if (local_330 != 0) {
        memcpy((void *)local_410._32_8_,local_340,local_330 * 8);
      }
    }
    else {
      local_410._32_8_ = local_340;
      local_410._40_8_ = local_338;
      local_338 = 6;
      local_330 = 0;
      local_340 = local_328;
    }
    tVar7 = local_2e8;
    if ((ulong)local_2f0 < 7) {
      local_410._104_8_ = (long)local_410 + 0x80;
      local_410._112_8_ = (type)0x6;
      if (local_2e8 != (type)0x0) {
        memcpy((void *)local_410._104_8_,(void *)local_2f8,(long)local_2e8 * 4);
      }
    }
    else {
      local_410._104_8_ = local_2f8;
      local_410._112_8_ = local_2f0;
      local_2f0 = (type)0x6;
      local_2e8 = (type)0x0;
      local_2f8 = (type)local_2e0;
    }
    local_410._120_8_ = tVar7;
    local_410._152_8_ = dVar5;
    iStack_370.m_data._0_8_ = dVar6;
    if (6 < (ulong)local_2f0) {
      operator_delete((void *)local_2f8,(long)local_2f0 << 2);
    }
    if (6 < local_338) {
      operator_delete(local_340,local_338 << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ == paVar1) {
      local_2c8._24_8_ = local_410._24_8_;
      local_2c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_2c8 + 0x10);
    }
    else {
      local_2c8._0_8_ = local_410._0_8_;
    }
    local_2c8._17_7_ = local_410._17_7_;
    local_2c8[0x10] = local_410[0x10];
    local_2c8._8_8_ = local_410._8_8_;
    local_410._8_8_ = 0;
    local_410[0x10] = '\0';
    if ((ulong)local_410._40_8_ < 7) {
      local_2c8._32_8_ = local_2c8 + 0x38;
      local_2c8._40_8_ = 6;
      local_410._0_8_ = paVar1;
      if (local_410._48_8_ != 0) {
        memcpy((void *)local_2c8._32_8_,(void *)local_410._32_8_,local_410._48_8_ * 8);
      }
    }
    else {
      local_2c8._32_8_ = local_410._32_8_;
      local_2c8._40_8_ = local_410._40_8_;
      local_410._40_8_ = 6;
      local_410._48_8_ = 0;
      local_410._0_8_ = paVar1;
      local_410._32_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_410 + 0x38);
    }
    if ((ulong)local_410._112_8_ < 7) {
      local_260 = (type)((long)local_2c8 + 0x80);
      local_258 = (type)0x6;
      if ((type)local_410._120_8_ != (type)0x0) {
        memcpy((void *)local_260,(void *)local_410._104_8_,local_410._120_8_ * 4);
      }
    }
    else {
      local_260 = (type)local_410._104_8_;
      local_258 = (type)local_410._112_8_;
      local_410._112_8_ = (type)0x6;
      local_410._120_8_ = (type)0x0;
      local_410._104_8_ = (long)local_410 + 0x80;
    }
    local_230 = (double)local_410._152_8_;
    dStack_228 = (double)iStack_370.m_data._0_8_;
    NVar13 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)this_00,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)local_2c8);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(this_00,NVar13);
    if (6 < (ulong)local_258) {
      operator_delete((void *)local_260,(long)local_258 << 2);
    }
    if (6 < (ulong)local_2c8._40_8_) {
      operator_delete((void *)local_2c8._32_8_,local_2c8._40_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_2c8 + 0x10)) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    if (6 < (ulong)local_410._112_8_) {
      operator_delete((void *)local_410._104_8_,local_410._112_8_ << 2);
    }
    if (6 < (ulong)local_410._40_8_) {
      operator_delete((void *)local_410._32_8_,local_410._40_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != paVar1) goto LAB_00168530;
  }
  bVar8 = true;
LAB_0016853f:
  if (6 < local_d8.affine_expr_.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d8.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_d8.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_d8.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d8.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_d8.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_d8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
    operator_delete(local_d8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,local_d8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                     _M_allocated_capacity + 1);
  }
  if (6 < local_100) {
    operator_delete(local_108,local_100 << 2);
  }
  if (6 < (ulong)local_150._8_8_) {
    operator_delete((void *)local_150._0_8_,local_150._8_8_ << 3);
  }
  return bVar8;
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }